

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::
VectorArgMinMaxBase<duckdb::LessThan,_true,_(duckdb::OrderType)3,_duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>_>
::Bind(VectorArgMinMaxBase<duckdb::LessThan,_true,_(duckdb::OrderType)3,_duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>_>
       *this,ClientContext *context,AggregateFunction *function,
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      *arguments)

{
  reference pvVar1;
  pointer pEVar2;
  reference this_00;
  reference pvVar3;
  
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if (pEVar2[0x39] == (Expression)0xc8) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,1);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    duckdb::ExpressionBinder::PushCollation(context,pvVar1,pEVar2 + 0x38,0);
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  pvVar3 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&function->field_0x48,0);
  if (pvVar3 != (reference)(pEVar2 + 0x38)) {
    *pvVar3 = (value_type)pEVar2[0x38];
    *(Expression *)(pvVar3 + 1) = pEVar2[0x39];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar3 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar2 + 0x40));
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if ((pointer)&function->field_0x90 != pEVar2 + 0x38) {
    function->field_0x90 = pEVar2[0x38];
    function->field_0x91 = pEVar2[0x39];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&function->field_0x98,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar2 + 0x40));
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, AggregateFunction &function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		if (arguments[1]->return_type.InternalType() == PhysicalType::VARCHAR) {
			ExpressionBinder::PushCollation(context, arguments[1], arguments[1]->return_type);
		}
		function.arguments[0] = arguments[0]->return_type;
		function.return_type = arguments[0]->return_type;
		return nullptr;
	}